

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall llvm::Triple::Triple(Triple *this,Twine *Str)

{
  StringRef *pSVar1;
  StringRef EnvironmentName;
  void *pvVar2;
  uint uVar3;
  ArchType AVar4;
  SubArchType SVar5;
  VendorType VVar6;
  OSType OVar7;
  EnvironmentType EVar8;
  ObjectFormatType OVar9;
  SmallVector<llvm::StringRef,_4U> Components;
  SmallVectorImpl<llvm::StringRef> local_88;
  StringRef local_78 [4];
  StringRef local_38;
  
  Twine::str_abi_cxx11_(&this->Data,Str);
  this->Arch = UnknownArch;
  this->SubArch = NoSubArch;
  this->Vendor = UnknownVendor;
  this->OS = UnknownOS;
  this->Environment = UnknownEnvironment;
  this->ObjectFormat = UnknownObjectFormat;
  local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 4;
  local_38.Data = (this->Data)._M_dataplus._M_p;
  local_38.Length = (this->Data)._M_string_length;
  local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_78;
  StringRef::split(&local_38,&local_88,'-',3,true);
  if (local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size != 0) {
    AVar4 = parseArch(*local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX);
    this->Arch = AVar4;
    if (local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 0) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    SVar5 = parseSubArch(*local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                          super_SmallVectorBase.BeginX);
    pvVar2 = local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
    this->SubArch = SVar5;
    uVar3 = local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
    if (1 < local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
      VVar6 = parseVendor(*(StringRef *)
                           ((long)local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + 0x10));
      this->Vendor = VVar6;
      if (uVar3 != 2) {
        OVar7 = parseOS(*(StringRef *)((long)pvVar2 + 0x20));
        this->OS = OVar7;
        if (3 < uVar3) {
          pSVar1 = (StringRef *)((long)pvVar2 + 0x30);
          EnvironmentName = *pSVar1;
          EVar8 = parseEnvironment(*pSVar1);
          this->Environment = EVar8;
          OVar9 = parseFormat(EnvironmentName);
          this->ObjectFormat = OVar9;
          goto LAB_0012ef32;
        }
      }
    }
  }
  OVar9 = this->ObjectFormat;
LAB_0012ef32:
  if (OVar9 == UnknownObjectFormat) {
    OVar9 = getDefaultFormat((Triple *)(ulong)this->Arch);
    this->ObjectFormat = OVar9;
  }
  if ((StringRef *)
      local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_78) {
    free(local_88.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

Triple::Triple(const Twine &Str)
    : Data(Str.str()), Arch(UnknownArch), SubArch(NoSubArch),
      Vendor(UnknownVendor), OS(UnknownOS), Environment(UnknownEnvironment),
      ObjectFormat(UnknownObjectFormat) {
  // Do minimal parsing by hand here.
  SmallVector<StringRef, 4> Components;
  StringRef(Data).split(Components, '-', /*MaxSplit*/ 3);
  if (Components.size() > 0) {
    Arch = parseArch(Components[0]);
    SubArch = parseSubArch(Components[0]);
    if (Components.size() > 1) {
      Vendor = parseVendor(Components[1]);
      if (Components.size() > 2) {
        OS = parseOS(Components[2]);
        if (Components.size() > 3) {
          Environment = parseEnvironment(Components[3]);
          ObjectFormat = parseFormat(Components[3]);
        }
      }
    }
  }
  if (ObjectFormat == UnknownObjectFormat)
    ObjectFormat = getDefaultFormat(*this);
}